

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_1::InvalidContextCase::iterate(InvalidContextCase *this)

{
  EGLDisplay display;
  TestLog *egl_00;
  bool bVar1;
  MessageBuilder *pMVar2;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_3c0;
  GetNameFunc local_3b0;
  int local_3a8;
  Enum<int,_2UL> local_3a0;
  MessageBuilder local_390;
  int local_20c;
  long lStack_208;
  EGLenum error;
  EGLContext context;
  string local_1f8;
  EGLint local_1d8 [2];
  EGLint attribList [7];
  MessageBuilder local_1b0;
  byte local_29;
  TestLog *pTStack_28;
  bool isOk;
  TestLog *log;
  Library *egl;
  InvalidContextCase *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)
        EglTestContext::getLibrary((this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx);
  pTStack_28 = tcu::TestContext::getLog
                         ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  local_29 = 1;
  tcu::TestLog::operator<<(&local_1b0,pTStack_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (&local_1b0,
                      (char (*) [151])
                      "EGL_BAD_ATTRIBUTE is generated if EXT_create_context_robustness is NOT supported but EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT is specified\n\n"
                     );
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  egl_00 = log;
  attribList[2] = 0x3138;
  attribList[3] = 0x31bf;
  attribList[4] = 0x3038;
  local_1d8[0] = 0x3098;
  local_1d8[1] = 3;
  attribList[0] = 0x30fb;
  attribList[1] = 1;
  display = (this->super_RobustnessTestCase).m_eglDisplay;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"EGL_EXT_create_context_robustness",
             (allocator<char> *)((long)&context + 7));
  bVar1 = eglu::hasExtension((Library *)egl_00,display,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&context + 7));
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_NOT_SUPPORTED,
               "Test requires EGL_EXT_create_context_robustness to be unsupported");
  }
  else {
    logAttribList((this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,local_1d8);
    lStack_208 = (*(code *)log->m_log[1].lock)
                           (log,(this->super_RobustnessTestCase).m_eglDisplay,
                            (this->super_RobustnessTestCase).m_eglConfig,0,local_1d8);
    local_20c = (*(code *)log->m_log[6].lock)();
    if (local_20c != 0x3004) {
      tcu::TestLog::operator<<(&local_390,pTStack_28,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<
                         (&local_390,
                          (char (*) [54])"Test failed! eglCreateContext() returned with error [");
      EVar3 = eglu::getErrorStr(local_20c);
      local_3b0 = EVar3.m_getName;
      local_3a8 = EVar3.m_value;
      local_3a0.m_getName = local_3b0;
      local_3a0.m_value = local_3a8;
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_3a0);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [12])", expected ");
      EVar3 = eglu::getErrorStr(0x3004);
      local_3c0.m_getName = EVar3.m_getName;
      local_3c0.m_value = EVar3.m_value;
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_3c0);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x5ae544);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_390);
      local_29 = 0;
    }
    if (lStack_208 != 0) {
      (**(code **)&log->m_log[3].isSessionOpen)
                (log,(this->super_RobustnessTestCase).m_eglDisplay,lStack_208);
    }
    if ((local_29 & 1) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.
                 m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
  }
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate	(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();
		bool			isOk	= true;

		log << tcu::TestLog::Message
			<< "EGL_BAD_ATTRIBUTE is generated if EXT_create_context_robustness is NOT supported but EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT is specified\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		if (eglu::hasExtension(egl, m_eglDisplay, "EGL_EXT_create_context_robustness"))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Test requires EGL_EXT_create_context_robustness to be unsupported");
			return STOP;
		}

		logAttribList(m_eglTestCtx, attribList);
		EGLContext context = egl.createContext(m_eglDisplay, m_eglConfig, EGL_NO_CONTEXT, attribList);

		const EGLenum error = egl.getError();
		if (error != EGL_BAD_ATTRIBUTE)
		{
			log << TestLog::Message
				<< "Test failed! eglCreateContext() returned with error [" << eglu::getErrorStr(error) << ", expected " << eglu::getErrorStr(EGL_BAD_ATTRIBUTE) << "]"
				<< TestLog::EndMessage;

			isOk = false;
		}

		if (context != EGL_NO_CONTEXT)
			egl.destroyContext(m_eglDisplay, context);

		if (isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}